

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

vector<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_> * __thiscall
GameEngine::getLightPlayers
          (vector<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>
           *__return_storage_ptr__,GameEngine *this)

{
  bool bVar1;
  undefined1 local_50 [24];
  shared_ptr<Player> *player;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *__range1;
  GameEngine *this_local;
  vector<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_> *lightPlayers
  ;
  
  std::vector<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>::vector
            (__return_storage_ptr__);
  __end1 = std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::begin
                     (&this->players);
  player = (shared_ptr<Player> *)
           std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::end
                     (&this->players);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
                                     *)&player), bVar1) {
    local_50._16_8_ =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
         ::operator*(&__end1);
    std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_50._16_8_);
    std::make_shared<LightPlayer,Player&>((Player *)local_50);
    std::vector<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>::
    push_back(__return_storage_ptr__,(value_type *)local_50);
    std::shared_ptr<LightPlayer>::~shared_ptr((shared_ptr<LightPlayer> *)local_50);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<LightPlayer> > GameEngine::getLightPlayers() {
  std::vector<std::shared_ptr<LightPlayer> > lightPlayers;

  for (const auto &player : players) {
    lightPlayers.push_back(std::make_shared<LightPlayer>(*player));
  }

  return lightPlayers;
}